

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

FT_Error TT_Set_Var_Design(TT_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  uint uVar1;
  FT_Memory memory;
  GX_Blend pGVar2;
  ulong uVar3;
  long lVar4;
  uint num_coords_00;
  bool bVar5;
  FT_Fixed *pFVar6;
  FT_Fixed *pFVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  FT_MM_Var *pFVar11;
  FT_Error error;
  FT_Error local_44;
  TT_Face local_40;
  FT_MM_Var *local_38;
  
  local_44 = 0;
  memory = (face->root).memory;
  if (face->blend == (GX_Blend)0x0) {
    local_44 = TT_Get_MM_Var(face,(FT_MM_Var **)0x0);
    pFVar6 = (FT_Fixed *)0x0;
    if (local_44 != 0) goto LAB_00258d4b;
  }
  pGVar2 = face->blend;
  pFVar11 = pGVar2->mmvar;
  uVar8 = pFVar11->num_axis;
  num_coords_00 = num_coords;
  if (uVar8 < num_coords) {
    num_coords_00 = uVar8;
  }
  if (pGVar2->coords == (FT_Fixed *)0x0) {
    local_40 = face;
    local_38 = pFVar11;
    pFVar7 = (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)uVar8,(void *)0x0,&local_44);
    pFVar6 = (FT_Fixed *)0x0;
    pGVar2->coords = pFVar7;
    pFVar11 = local_38;
    face = local_40;
    if (local_44 != 0) goto LAB_00258d4b;
  }
  pFVar6 = pGVar2->coords;
  if (num_coords_00 == 0) {
    uVar8 = 0;
    bVar5 = false;
  }
  else {
    if ((ulong)uVar8 < (ulong)num_coords) {
      num_coords = uVar8;
    }
    lVar9 = 0;
    lVar10 = 0;
    bVar5 = false;
    do {
      if (pFVar6[lVar10] != coords[lVar10]) {
        pFVar6[lVar10] = coords[lVar10];
        bVar5 = true;
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + -8;
    } while (num_coords != (uint)lVar10);
    pFVar6 = (FT_Fixed *)((long)pFVar6 - lVar9);
    uVar8 = num_coords_00;
  }
  uVar3 = (face->root).face_index;
  uVar1 = pFVar11->num_axis;
  if ((uVar3 & 0x7fff0000) == 0) {
    if (uVar8 < uVar1) {
      pFVar7 = &pFVar11->axis[num_coords_00].def;
      lVar9 = 0;
      do {
        if (pFVar6[lVar9] != *pFVar7) {
          pFVar6[lVar9] = *pFVar7;
          bVar5 = true;
        }
        pFVar7 = pFVar7 + 6;
        lVar9 = lVar9 + 1;
      } while (uVar1 - num_coords_00 != (int)lVar9);
    }
  }
  else if (uVar8 < uVar1) {
    lVar9 = *(long *)((long)&pFVar11->namedstyle[-1].coords +
                     (ulong)((uint)uVar3 >> 0xc & 0xfffffff0));
    lVar10 = 0;
    do {
      lVar4 = *(long *)((ulong)num_coords_00 * 8 + lVar9 + lVar10 * 8);
      if (pFVar6[lVar10] != lVar4) {
        pFVar6[lVar10] = lVar4;
        bVar5 = true;
      }
      lVar10 = lVar10 + 1;
    } while (uVar1 - num_coords_00 != (int)lVar10);
  }
  if (!bVar5 && pGVar2->normalizedcoords != (FT_Fixed *)0x0) {
    return -1;
  }
  pFVar6 = (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)pFVar11->num_axis,(void *)0x0,&local_44);
  if (local_44 == 0) {
    if (face->blend->avar_loaded == '\0') {
      ft_var_load_avar(face);
    }
    ft_var_to_normalized(face,num_coords_00,pGVar2->coords,pFVar6);
    local_44 = tt_set_mm_blend(face,pFVar11->num_axis,pFVar6,'\0');
    if (local_44 == 0) {
      (face->root).face_flags =
           (ulong)(num_coords_00 != 0) << 0xf | (face->root).face_flags & 0xffffffffffff7fffU;
    }
  }
LAB_00258d4b:
  ft_mem_free(memory,pFVar6);
  return local_44;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Set_Var_Design( TT_Face    face,
                     FT_UInt    num_coords,
                     FT_Fixed*  coords )
  {
    FT_Error    error  = FT_Err_Ok;
    GX_Blend    blend;
    FT_MM_Var*  mmvar;
    FT_UInt     i;
    FT_Memory   memory = face->root.memory;

    FT_Fixed*  c;
    FT_Fixed*  n;
    FT_Fixed*  normalized = NULL;

    FT_Bool  have_diff = 0;


    if ( !face->blend )
    {
      if ( FT_SET_ERROR( TT_Get_MM_Var( face, NULL ) ) )
        goto Exit;
    }

    blend = face->blend;
    mmvar = blend->mmvar;

    if ( num_coords > mmvar->num_axis )
    {
      FT_TRACE2(( "TT_Set_Var_Design:"
                  " only using first %d of %d coordinates\n",
                  mmvar->num_axis, num_coords ));
      num_coords = mmvar->num_axis;
    }

    if ( !blend->coords )
    {
      if ( FT_NEW_ARRAY( blend->coords, mmvar->num_axis ) )
        goto Exit;
    }

    c = blend->coords;
    n = coords;
    for ( i = 0; i < num_coords; i++, n++, c++ )
    {
      if ( *c != *n )
      {
        *c        = *n;
        have_diff = 1;
      }
    }

    if ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) )
    {
      FT_UInt              instance_index;
      FT_Var_Named_Style*  named_style;


      instance_index = (FT_UInt)face->root.face_index >> 16;
      named_style    = mmvar->namedstyle + instance_index - 1;

      n = named_style->coords + num_coords;
      for ( ; i < mmvar->num_axis; i++, n++, c++ )
      {
        if ( *c != *n )
        {
          *c        = *n;
          have_diff = 1;
        }
      }
    }
    else
    {
      FT_Var_Axis*  a;


      a = mmvar->axis + num_coords;
      for ( ; i < mmvar->num_axis; i++, a++, c++ )
      {
        if ( *c != a->def )
        {
          *c        = a->def;
          have_diff = 1;
        }
      }
    }

    /* return value -1 indicates `no change';                      */
    /* we can exit early if `normalizedcoords' is already computed */
    if ( blend->normalizedcoords && !have_diff )
      return -1;

    if ( FT_NEW_ARRAY( normalized, mmvar->num_axis ) )
      goto Exit;

    if ( !face->blend->avar_loaded )
      ft_var_load_avar( face );

    FT_TRACE5(( "TT_Set_Var_Design:\n" ));
    FT_TRACE5(( "  normalized design coordinates:\n" ));
    ft_var_to_normalized( face, num_coords, blend->coords, normalized );

    error = tt_set_mm_blend( face, mmvar->num_axis, normalized, 0 );
    if ( error )
      goto Exit;

    if ( num_coords )
      face->root.face_flags |= FT_FACE_FLAG_VARIATION;
    else
      face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;

  Exit:
    FT_FREE( normalized );
    return error;
  }